

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureFilteringTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Accuracy::Texture2DFilteringCase::iterate(Texture2DFilteringCase *this)

{
  code *pcVar1;
  RenderContext *context;
  TestContext *this_00;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  TestLog *log_00;
  undefined4 extraout_var_00;
  char *pcVar5;
  reference ppTVar6;
  Texture2D *pTVar7;
  TextureFormat *format;
  NotSupportedError *this_01;
  reference pvVar8;
  undefined4 extraout_var_01;
  PixelFormat *pPVar9;
  undefined4 extraout_var_02;
  size_type sVar10;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  float fVar11;
  Texture2DView TVar12;
  string local_330;
  int local_30c [2];
  int score;
  int worstScoreDiff;
  int bestScoreDiff;
  Texture2DView local_2d8;
  SurfaceAccess local_2c8;
  Vector<float,_2> local_2a8;
  Vector<float,_2> local_2a0;
  Texture2DView local_298;
  SurfaceAccess local_288;
  Vector<float,_2> local_268;
  Vector<float,_2> local_260;
  float local_258;
  float local_254;
  float tRange;
  float sRange;
  float tMin;
  float sMin;
  ConstPixelBufferAccess *local_240;
  SurfaceAccess local_238;
  Vector<float,_2> local_218;
  Vector<float,_2> local_210;
  Texture2DView local_208;
  SurfaceAccess local_1f8;
  Vector<float,_2> local_1d8;
  Vector<float,_2> local_1d0;
  TextureFormat local_1c8;
  Sampler local_1c0;
  int local_184;
  int local_180;
  int curTexNdx;
  int topHeight;
  int bottomHeight;
  int rightWidth;
  int leftWidth;
  vector<float,_std::allocator<float>_> texCoord;
  ReferenceParams refParams;
  TextureFormatInfo fmtInfo;
  TextureFormat *texFmt;
  undefined1 local_68 [8];
  Surface referenceFrame;
  Surface renderedFrame;
  RandomViewport viewport;
  int defViewportHeight;
  int defViewportWidth;
  TestLog *log;
  Functions *gl;
  Texture2DFilteringCase *this_local;
  long lVar4;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pcVar5 = tcu::TestNode::getName((TestNode *)this);
  dVar3 = deStringHash(pcVar5);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&renderedFrame.m_pixels.m_cap,
             (RenderTarget *)CONCAT44(extraout_var_00,iVar2),0x100,0x100,dVar3);
  tcu::Surface::Surface((Surface *)&referenceFrame.m_pixels.m_cap,viewport.x,viewport.y);
  tcu::Surface::Surface((Surface *)local_68,viewport.x,viewport.y);
  ppTVar6 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                      (&this->m_textures,0);
  pTVar7 = glu::Texture2D::getRefTexture(*ppTVar6);
  format = tcu::TextureLevelPyramid::getFormat(&pTVar7->super_TextureLevelPyramid);
  tcu::getTextureFormatInfo((TextureFormatInfo *)&refParams.baseLevel,format);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)
             ((long)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),TEXTURETYPE_2D);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&rightWidth);
  if ((0xff < viewport.x) && (0xff < viewport.y)) {
    bottomHeight = viewport.x / 2;
    topHeight = viewport.x - bottomHeight;
    curTexNdx = viewport.y / 2;
    local_180 = viewport.y - curTexNdx;
    local_184 = 0;
    (**(code **)(lVar4 + 8))(0x84c0);
    pcVar1 = *(code **)(lVar4 + 0xb8);
    ppTVar6 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                        (&this->m_textures,(long)local_184);
    dVar3 = glu::Texture2D::getGLTexture(*ppTVar6);
    (*pcVar1)(0xde1,dVar3);
    (**(code **)(lVar4 + 0x1360))(0xde1,0x2802,this->m_wrapS);
    (**(code **)(lVar4 + 0x1360))(0xde1,0x2803,this->m_wrapT);
    (**(code **)(lVar4 + 0x1360))(0xde1,0x2801,this->m_minFilter);
    (**(code **)(lVar4 + 0x1360))(0xde1,0x2800,this->m_magFilter);
    glu::mapGLSampler(&local_1c0,this->m_wrapS,this->m_wrapT,this->m_minFilter,this->m_magFilter);
    tcu::Sampler::operator=
              ((Sampler *)(refParams.super_RenderParams.colorBias.m_data + 2),&local_1c0);
    local_1c8 = *format;
    glu::TextureTestUtil::getSamplerType(local_1c8);
    refParams.sampler.seamlessCubeMap = false;
    refParams.sampler._53_3_ = 0;
    (**(code **)(lVar4 + 0x1a00))
              ((int)renderedFrame.m_pixels.m_cap,renderedFrame.m_pixels.m_cap._4_4_,bottomHeight,
               curTexNdx);
    tcu::Vector<float,_2>::Vector(&local_1d0,-4.0,-4.5);
    tcu::Vector<float,_2>::Vector(&local_1d8,4.0,2.5);
    glu::TextureTestUtil::computeQuadTexCoord2D
              ((vector<float,_std::allocator<float>_> *)&rightWidth,&local_1d0,&local_1d8);
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&rightWidth,0);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (&this->m_renderer,0,pvVar8,
               (RenderParams *)
               ((long)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4));
    iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    pPVar9 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_01,iVar2));
    tcu::SurfaceAccess::SurfaceAccess
              (&local_1f8,(Surface *)local_68,pPVar9,0,0,bottomHeight,curTexNdx);
    ppTVar6 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                        (&this->m_textures,(long)local_184);
    pTVar7 = glu::Texture2D::getRefTexture(*ppTVar6);
    TVar12 = tcu::Texture2D::operator_cast_to_Texture2DView(pTVar7);
    local_208.m_levels = TVar12.m_levels;
    local_208.m_numLevels = TVar12.m_numLevels;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&rightWidth,0);
    glu::TextureTestUtil::sampleTexture
              (&local_1f8,&local_208,pvVar8,
               (ReferenceParams *)
               ((long)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4));
    (**(code **)(lVar4 + 0x1a00))
              ((int)renderedFrame.m_pixels.m_cap + bottomHeight,renderedFrame.m_pixels.m_cap._4_4_,
               topHeight,curTexNdx);
    tcu::Vector<float,_2>::Vector(&local_210,-0.5,0.75);
    tcu::Vector<float,_2>::Vector(&local_218,0.25,1.25);
    glu::TextureTestUtil::computeQuadTexCoord2D
              ((vector<float,_std::allocator<float>_> *)&rightWidth,&local_210,&local_218);
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&rightWidth,0);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (&this->m_renderer,0,pvVar8,
               (RenderParams *)
               ((long)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4));
    iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    pPVar9 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_02,iVar2));
    tcu::SurfaceAccess::SurfaceAccess
              (&local_238,(Surface *)local_68,pPVar9,bottomHeight,0,topHeight,curTexNdx);
    ppTVar6 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                        (&this->m_textures,(long)local_184);
    pTVar7 = glu::Texture2D::getRefTexture(*ppTVar6);
    TVar12 = tcu::Texture2D::operator_cast_to_Texture2DView(pTVar7);
    local_240 = TVar12.m_levels;
    tMin = (float)TVar12.m_numLevels;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&rightWidth,0);
    glu::TextureTestUtil::sampleTexture
              (&local_238,(Texture2DView *)&tMin,pvVar8,
               (ReferenceParams *)
               ((long)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4));
    sVar10 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::size
                       (&this->m_textures);
    if (1 < sVar10) {
      local_184 = local_184 + 1;
      pcVar1 = *(code **)(lVar4 + 0xb8);
      ppTVar6 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                          (&this->m_textures,(long)local_184);
      dVar3 = glu::Texture2D::getGLTexture(*ppTVar6);
      (*pcVar1)(0xde1,dVar3);
      (**(code **)(lVar4 + 0x1360))(0xde1,0x2802,this->m_wrapS);
      (**(code **)(lVar4 + 0x1360))(0xde1,0x2803,this->m_wrapT);
      (**(code **)(lVar4 + 0x1360))(0xde1,0x2801,this->m_minFilter);
      (**(code **)(lVar4 + 0x1360))(0xde1,0x2800,this->m_magFilter);
    }
    (**(code **)(lVar4 + 0x1a00))
              ((int)renderedFrame.m_pixels.m_cap,renderedFrame.m_pixels.m_cap._4_4_ + curTexNdx,
               bottomHeight,local_180);
    sRange = -0.5;
    tRange = -0.2;
    fVar11 = (float)bottomHeight;
    ppTVar6 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                        (&this->m_textures,(long)local_184);
    pTVar7 = glu::Texture2D::getRefTexture(*ppTVar6);
    iVar2 = tcu::Texture2D::getWidth(pTVar7);
    local_254 = (fVar11 * 1.2) / (float)iVar2;
    fVar11 = (float)local_180;
    ppTVar6 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                        (&this->m_textures,(long)local_184);
    pTVar7 = glu::Texture2D::getRefTexture(*ppTVar6);
    iVar2 = tcu::Texture2D::getHeight(pTVar7);
    local_258 = (fVar11 * 1.1) / (float)iVar2;
    tcu::Vector<float,_2>::Vector(&local_260,sRange,tRange);
    tcu::Vector<float,_2>::Vector(&local_268,sRange + local_254,tRange + local_258);
    glu::TextureTestUtil::computeQuadTexCoord2D
              ((vector<float,_std::allocator<float>_> *)&rightWidth,&local_260,&local_268);
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&rightWidth,0);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (&this->m_renderer,0,pvVar8,
               (RenderParams *)
               ((long)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4));
    iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    pPVar9 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_03,iVar2));
    tcu::SurfaceAccess::SurfaceAccess
              (&local_288,(Surface *)local_68,pPVar9,0,curTexNdx,bottomHeight,local_180);
    ppTVar6 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                        (&this->m_textures,(long)local_184);
    pTVar7 = glu::Texture2D::getRefTexture(*ppTVar6);
    TVar12 = tcu::Texture2D::operator_cast_to_Texture2DView(pTVar7);
    local_298.m_levels = TVar12.m_levels;
    local_298.m_numLevels = TVar12.m_numLevels;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&rightWidth,0);
    glu::TextureTestUtil::sampleTexture
              (&local_288,&local_298,pvVar8,
               (ReferenceParams *)
               ((long)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4));
    (**(code **)(lVar4 + 0x1a00))
              ((int)renderedFrame.m_pixels.m_cap + bottomHeight,
               renderedFrame.m_pixels.m_cap._4_4_ + curTexNdx,topHeight,local_180);
    tcu::Vector<float,_2>::Vector(&local_2a0,-0.5,0.75);
    tcu::Vector<float,_2>::Vector(&local_2a8,0.25,1.25);
    glu::TextureTestUtil::computeQuadTexCoord2D
              ((vector<float,_std::allocator<float>_> *)&rightWidth,&local_2a0,&local_2a8);
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&rightWidth,0);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (&this->m_renderer,0,pvVar8,
               (RenderParams *)
               ((long)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4));
    iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    pPVar9 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_04,iVar2));
    tcu::SurfaceAccess::SurfaceAccess
              (&local_2c8,(Surface *)local_68,pPVar9,bottomHeight,curTexNdx,topHeight,local_180);
    ppTVar6 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                        (&this->m_textures,(long)local_184);
    pTVar7 = glu::Texture2D::getRefTexture(*ppTVar6);
    TVar12 = tcu::Texture2D::operator_cast_to_Texture2DView(pTVar7);
    local_2d8.m_levels = TVar12.m_levels;
    local_2d8.m_numLevels = TVar12.m_numLevels;
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&rightWidth,0);
    glu::TextureTestUtil::sampleTexture
              (&local_2c8,&local_2d8,pvVar8,
               (ReferenceParams *)
               ((long)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4));
    context = this->m_renderCtx;
    tcu::Surface::getAccess
              ((PixelBufferAccess *)&worstScoreDiff,(Surface *)&referenceFrame.m_pixels.m_cap);
    glu::readPixels(context,(int)renderedFrame.m_pixels.m_cap,renderedFrame.m_pixels.m_cap._4_4_,
                    (PixelBufferAccess *)&worstScoreDiff);
    score = 0x10;
    local_30c[1] = 0xc80;
    local_30c[0] = glu::TextureTestUtil::measureAccuracy
                             (log_00,(Surface *)local_68,(Surface *)&referenceFrame.m_pixels.m_cap,
                              0x10,0xc80);
    this_00 = (this->super_TestCase).super_TestNode.m_testCtx;
    de::toString<int>(&local_330,local_30c);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,pcVar5);
    std::__cxx11::string::~string((string *)&local_330);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)&rightWidth);
    tcu::Surface::~Surface((Surface *)local_68);
    tcu::Surface::~Surface((Surface *)&referenceFrame.m_pixels.m_cap);
    return STOP;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Too small viewport","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/accuracy/es3aTextureFilteringTests.cpp"
             ,200);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

Texture2DFilteringCase::IterateResult Texture2DFilteringCase::iterate (void)
{
	const glw::Functions&		gl					= m_renderCtx.getFunctions();
	TestLog&					log					= m_testCtx.getLog();
	const int					defViewportWidth	= 256;
	const int					defViewportHeight	= 256;
	RandomViewport				viewport			(m_renderCtx.getRenderTarget(), defViewportWidth, defViewportHeight, deStringHash(getName()));
	tcu::Surface				renderedFrame		(viewport.width, viewport.height);
	tcu::Surface				referenceFrame		(viewport.width, viewport.height);
	const tcu::TextureFormat&	texFmt				= m_textures[0]->getRefTexture().getFormat();
	tcu::TextureFormatInfo		fmtInfo				= tcu::getTextureFormatInfo(texFmt);
	ReferenceParams				refParams			(TEXTURETYPE_2D);
	vector<float>				texCoord;

	// Accuracy measurements are off unless viewport size is 256x256
	if (viewport.width < defViewportWidth || viewport.height < defViewportHeight)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Viewport is divided into 4 sections.
	int				leftWidth			= viewport.width / 2;
	int				rightWidth			= viewport.width - leftWidth;
	int				bottomHeight		= viewport.height / 2;
	int				topHeight			= viewport.height - bottomHeight;

	int				curTexNdx			= 0;

	// Use unit 0.
	gl.activeTexture(GL_TEXTURE0);

	// Bind gradient texture and setup sampler parameters.
	gl.bindTexture(GL_TEXTURE_2D, m_textures[curTexNdx]->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	m_magFilter);

	// Setup params for reference.
	refParams.sampler		= glu::mapGLSampler(m_wrapS, m_wrapT, m_minFilter, m_magFilter);
	refParams.samplerType	= getSamplerType(texFmt);
	refParams.lodMode		= LODMODE_EXACT;
	refParams.colorBias		= fmtInfo.lookupBias;
	refParams.colorScale	= fmtInfo.lookupScale;

	// Bottom left: Minification
	{
		gl.viewport(viewport.x, viewport.y, leftWidth, bottomHeight);

		computeQuadTexCoord2D(texCoord, tcu::Vec2(-4.0f, -4.5f), tcu::Vec2(4.0f, 2.5f));

		m_renderer.renderQuad(0, &texCoord[0], refParams);
		sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), 0, 0, leftWidth, bottomHeight),
					  m_textures[curTexNdx]->getRefTexture(), &texCoord[0], refParams);
	}

	// Bottom right: Magnification
	{
		gl.viewport(viewport.x+leftWidth, viewport.y, rightWidth, bottomHeight);

		computeQuadTexCoord2D(texCoord, tcu::Vec2(-0.5f, 0.75f), tcu::Vec2(0.25f, 1.25f));

		m_renderer.renderQuad(0, &texCoord[0], refParams);
		sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), leftWidth, 0, rightWidth, bottomHeight),
					  m_textures[curTexNdx]->getRefTexture(), &texCoord[0], refParams);
	}

	if (m_textures.size() >= 2)
	{
		curTexNdx += 1;

		// Setup second texture.
		gl.bindTexture(GL_TEXTURE_2D, m_textures[curTexNdx]->getGLTexture());
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		m_wrapS);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		m_wrapT);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	m_magFilter);
	}

	// Top left: Minification
	// \note Minification is chosen so that 0.0 < lod <= 0.5. This way special minification threshold rule will be triggered.
	{
		gl.viewport(viewport.x, viewport.y+bottomHeight, leftWidth, topHeight);

		float	sMin		= -0.5f;
		float	tMin		= -0.2f;
		float	sRange		= ((float)leftWidth * 1.2f) / (float)m_textures[curTexNdx]->getRefTexture().getWidth();
		float	tRange		= ((float)topHeight * 1.1f) / (float)m_textures[curTexNdx]->getRefTexture().getHeight();

		computeQuadTexCoord2D(texCoord, tcu::Vec2(sMin, tMin), tcu::Vec2(sMin+sRange, tMin+tRange));

		m_renderer.renderQuad(0, &texCoord[0], refParams);
		sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), 0, bottomHeight, leftWidth, topHeight),
					  m_textures[curTexNdx]->getRefTexture(), &texCoord[0], refParams);
	}

	// Top right: Magnification
	{
		gl.viewport(viewport.x+leftWidth, viewport.y+bottomHeight, rightWidth, topHeight);

		computeQuadTexCoord2D(texCoord, tcu::Vec2(-0.5f, 0.75f), tcu::Vec2(0.25f, 1.25f));

		m_renderer.renderQuad(0, &texCoord[0], refParams);
		sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), leftWidth, bottomHeight, rightWidth, topHeight),
					  m_textures[curTexNdx]->getRefTexture(), &texCoord[0], refParams);
	}

	// Read result.
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	// Compare and log.
	{
		const int	bestScoreDiff	= 16;
		const int	worstScoreDiff	= 3200;

		int score = measureAccuracy(log, referenceFrame, renderedFrame, bestScoreDiff, worstScoreDiff);
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::toString(score).c_str());
	}

	return STOP;
}